

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O0

obj * worst_cursed_item(void)

{
  boolean bVar1;
  int iVar2;
  obj *local_18;
  obj *otmp;
  
  iVar2 = near_capacity();
  if (2 < iVar2) {
    for (local_18 = invent; local_18 != (obj *)0x0; local_18 = local_18->nobj) {
      if (((local_18 != (obj *)0x0) && (local_18->otyp == 0x210)) &&
         ((*(uint *)&local_18->field_0x4a & 1) != 0)) {
        return local_18;
      }
    }
  }
  iVar2 = welded(uwep);
  if ((iVar2 == 0) ||
     ((uright == (obj *)0x0 &&
      (((uwep->oclass != '\x02' && (uwep->oclass != '\x06')) ||
       ((*(ushort *)&objects[uwep->otyp].field_0x11 & 1) == 0)))))) {
    if ((uarmg == (obj *)0x0) || ((*(uint *)&uarmg->field_0x4a & 1) == 0)) {
      if ((uarms == (obj *)0x0) || ((*(uint *)&uarms->field_0x4a & 1) == 0)) {
        if ((uarmc == (obj *)0x0) || ((*(uint *)&uarmc->field_0x4a & 1) == 0)) {
          if ((uarm == (obj *)0x0) || ((*(uint *)&uarm->field_0x4a & 1) == 0)) {
            if ((uarmh == (obj *)0x0) || ((*(uint *)&uarmh->field_0x4a & 1) == 0)) {
              if ((uarmf == (obj *)0x0) || ((*(uint *)&uarmf->field_0x4a & 1) == 0)) {
                if ((uarmu == (obj *)0x0) || ((*(uint *)&uarmu->field_0x4a & 1) == 0)) {
                  if ((uamul == (obj *)0x0) || ((*(uint *)&uamul->field_0x4a & 1) == 0)) {
                    if ((uleft == (obj *)0x0) || ((*(uint *)&uleft->field_0x4a & 1) == 0)) {
                      if ((uright == (obj *)0x0) || ((*(uint *)&uright->field_0x4a & 1) == 0)) {
                        if ((ublindf == (obj *)0x0) || ((*(uint *)&ublindf->field_0x4a & 1) == 0)) {
                          iVar2 = welded(uwep);
                          if (iVar2 == 0) {
                            if (((uswapwep == (obj *)0x0) ||
                                ((*(uint *)&uswapwep->field_0x4a & 1) == 0)) || (u.twoweap == '\0'))
                            {
                              local_18 = invent;
                              while ((local_18 != (obj *)0x0 &&
                                     (((*(uint *)&local_18->field_0x4a & 1) == 0 ||
                                      ((local_18->otyp != 0x210 &&
                                       (bVar1 = confers_luck(local_18), bVar1 == '\0'))))))) {
                                local_18 = local_18->nobj;
                              }
                            }
                            else {
                              local_18 = uswapwep;
                            }
                          }
                          else {
                            local_18 = uwep;
                          }
                        }
                        else {
                          local_18 = ublindf;
                        }
                      }
                      else {
                        local_18 = uright;
                      }
                    }
                    else {
                      local_18 = uleft;
                    }
                  }
                  else {
                    local_18 = uamul;
                  }
                }
                else {
                  local_18 = uarmu;
                }
              }
              else {
                local_18 = uarmf;
              }
            }
            else {
              local_18 = uarmh;
            }
          }
          else {
            local_18 = uarm;
          }
        }
        else {
          local_18 = uarmc;
        }
      }
      else {
        local_18 = uarms;
      }
    }
    else {
      local_18 = uarmg;
    }
  }
  else {
    local_18 = uwep;
  }
  return local_18;
}

Assistant:

static struct obj *worst_cursed_item(void)
{
    struct obj *otmp;

    /* if strained or worse, check for loadstone first */
    if (near_capacity() >= HVY_ENCUMBER) {
	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (Cursed_obj(otmp, LOADSTONE)) return otmp;
    }
    /* weapon takes precedence if it is interfering
       with taking off a ring or putting on a shield */
    if (welded(uwep) && (uright || bimanual(uwep))) {	/* weapon */
	otmp = uwep;
    /* gloves come next, due to rings */
    } else if (uarmg && uarmg->cursed) {		/* gloves */
	otmp = uarmg;
    /* then shield due to two handed weapons and spells */
    } else if (uarms && uarms->cursed) {		/* shield */
	otmp = uarms;
    /* then cloak due to body armor */
    } else if (uarmc && uarmc->cursed) {		/* cloak */
	otmp = uarmc;
    } else if (uarm && uarm->cursed) {			/* suit */
	otmp = uarm;
    } else if (uarmh && uarmh->cursed) {		/* helmet */
	otmp = uarmh;
    } else if (uarmf && uarmf->cursed) {		/* boots */
	otmp = uarmf;
    } else if (uarmu && uarmu->cursed) {		/* shirt */
	otmp = uarmu;
    } else if (uamul && uamul->cursed) {		/* amulet */
	otmp = uamul;
    } else if (uleft && uleft->cursed) {		/* left ring */
	otmp = uleft;
    } else if (uright && uright->cursed) {		/* right ring */
	otmp = uright;
    } else if (ublindf && ublindf->cursed) {		/* eyewear */
	otmp = ublindf;	/* must be non-blinding lenses */
    /* if weapon wasn't handled above, do it now */
    } else if (welded(uwep)) {				/* weapon */
	otmp = uwep;
    /* active secondary weapon even though it isn't welded */
    } else if (uswapwep && uswapwep->cursed && u.twoweap) {
	otmp = uswapwep;
    /* all worn items ought to be handled by now */
    } else {
	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    if (!otmp->cursed) continue;
	    if (otmp->otyp == LOADSTONE || confers_luck(otmp))
		break;
	}
    }
    return otmp;
}